

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modm-donna-64bit.h
# Opt level: O3

void expand256_modm(bignum256modm_element_t *out,uchar *in,size_t len)

{
  bignum256modm q1;
  uchar work [64];
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  memcpy(&local_68,in,len);
  *out = local_68 & 0xffffffffffffff;
  out[1] = (uStack_60 & 0xffffffffffff) << 8 | local_68 >> 0x38;
  out[2] = (local_58 & 0xffffffffff) << 0x10 | uStack_60 >> 0x30;
  out[3] = (uStack_50 & 0xffffffff) << 0x18 | local_58 >> 0x28;
  out[4] = (local_48 & 0xff) << 0x20 | uStack_50 >> 0x20;
  if (0x1f < len) {
    local_98 = uStack_50 >> 0x38 | (local_48 & 0xffffffffffff) << 8;
    local_90 = local_48 >> 0x30 | (uStack_40 & 0xffffffffff) << 0x10;
    local_88 = uStack_40 >> 0x28 | (local_38 & 0xffffffff) << 0x18;
    local_80 = local_38 >> 0x20 | (uStack_30 & 0xffffff) << 0x20;
    local_78 = uStack_30 >> 0x18;
    barrett_reduce256_modm(out,&local_98,out);
  }
  return;
}

Assistant:

static void
expand256_modm(bignum256modm out, const unsigned char *in, size_t len) {
	unsigned char work[64] = {0};
	bignum256modm_element_t x[16];
	bignum256modm q1;

	memcpy(work, in, len);
	x[0] = U8TO64_LE(work +  0);
	x[1] = U8TO64_LE(work +  8);
	x[2] = U8TO64_LE(work + 16);
	x[3] = U8TO64_LE(work + 24);
	x[4] = U8TO64_LE(work + 32);
	x[5] = U8TO64_LE(work + 40);
	x[6] = U8TO64_LE(work + 48);
	x[7] = U8TO64_LE(work + 56);

	/* r1 = (x mod 256^(32+1)) = x mod (2^8)(31+1) = x & ((1 << 264) - 1) */
	out[0] = (                         x[0]) & 0xffffffffffffff;
	out[1] = ((x[ 0] >> 56) | (x[ 1] <<  8)) & 0xffffffffffffff;
	out[2] = ((x[ 1] >> 48) | (x[ 2] << 16)) & 0xffffffffffffff;
	out[3] = ((x[ 2] >> 40) | (x[ 3] << 24)) & 0xffffffffffffff;
	out[4] = ((x[ 3] >> 32) | (x[ 4] << 32)) & 0x0000ffffffffff;

	/* under 252 bits, no need to reduce */
	if (len < 32)
		return;

	/* q1 = x >> 248 = 264 bits */
	q1[0] = ((x[ 3] >> 56) | (x[ 4] <<  8)) & 0xffffffffffffff;
	q1[1] = ((x[ 4] >> 48) | (x[ 5] << 16)) & 0xffffffffffffff;
	q1[2] = ((x[ 5] >> 40) | (x[ 6] << 24)) & 0xffffffffffffff;
	q1[3] = ((x[ 6] >> 32) | (x[ 7] << 32)) & 0xffffffffffffff;
	q1[4] = ((x[ 7] >> 24)                );

	barrett_reduce256_modm(out, q1, out);
}